

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

void secp256k1_context_set_error_callback
               (secp256k1_context *ctx,_func_void_char_ptr_void_ptr *fun,void *data)

{
  code *pcVar1;
  
  if (secp256k1_context_static != ctx) {
    pcVar1 = secp256k1_default_error_callback_fn;
    if (fun != (_func_void_char_ptr_void_ptr *)0x0) {
      pcVar1 = fun;
    }
    (ctx->error_callback).fn = pcVar1;
    (ctx->error_callback).data = data;
    return;
  }
  secp256k1_context_set_error_callback_cold_1();
  return;
}

Assistant:

void secp256k1_context_set_error_callback(secp256k1_context* ctx, void (*fun)(const char* message, void* data), const void* data) {
    /* We compare pointers instead of checking secp256k1_context_is_proper() here
       because setting callbacks is allowed on *copies* of the static context:
       it's harmless and makes testing easier. */
    ARG_CHECK_VOID(ctx != secp256k1_context_static);
    if (fun == NULL) {
        fun = secp256k1_default_error_callback_fn;
    }
    ctx->error_callback.fn = fun;
    ctx->error_callback.data = data;
}